

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

bool __thiscall
HighsLpRelaxation::computeDualInfProof
          (HighsLpRelaxation *this,HighsDomain *globaldomain,vector<int,_std::allocator<int>_> *inds
          ,vector<double,_std::allocator<double>_> *vals,double *rhs)

{
  bool bVar1;
  
  bVar1 = this->hasdualproof;
  if (bVar1 == true) {
    std::vector<int,_std::allocator<int>_>::operator=(inds,&this->dualproofinds);
    std::vector<double,_std::allocator<double>_>::operator=(vals,&this->dualproofvals);
    *rhs = this->dualproofrhs;
  }
  return bVar1;
}

Assistant:

bool HighsLpRelaxation::computeDualInfProof(const HighsDomain& globaldomain,
                                            std::vector<HighsInt>& inds,
                                            std::vector<double>& vals,
                                            double& rhs) {
  if (!hasdualproof) return false;

  assert(std::isfinite(dualproofrhs));

  inds = dualproofinds;
  vals = dualproofvals;
  rhs = dualproofrhs;
  return true;
}